

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

cio_error cio_eventloop_run(cio_eventloop *loop)

{
  cio_event_notifier *evn_00;
  uint uVar1;
  epoll_event *__events;
  int *piVar2;
  uint32_t events_type;
  cio_event_notifier *evn;
  int num_events;
  epoll_event *events;
  cio_eventloop *loop_local;
  
  __events = loop->epoll_events;
  do {
    while (uVar1 = epoll_wait(loop->epoll_fd,(epoll_event *)__events,100,-1), (int)uVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        piVar2 = __errno_location();
        return -*piVar2;
      }
    }
    loop->num_events = uVar1;
    loop->event_counter = 0;
    while (loop->event_counter < loop->num_events) {
      evn_00 = (cio_event_notifier *)__events[loop->event_counter].data.ptr;
      if (evn_00 == &loop->stop_ev) {
        return CIO_SUCCESS;
      }
      uVar1 = __events[loop->event_counter].events;
      loop->current_ev = evn_00;
      if ((uVar1 & 1 & evn_00->registered_events) != 0) {
        (*evn_00->read_callback)(evn_00->context,CIO_EPOLL_SUCCESS);
      }
      handle_removed_ev(loop,evn_00,uVar1);
      loop->event_counter = loop->event_counter + 1;
    }
  } while( true );
}

Assistant:

enum cio_error cio_eventloop_run(struct cio_eventloop *loop)
{
	struct epoll_event *events = loop->epoll_events;

	while (true) {
		int num_events =
		    epoll_wait(loop->epoll_fd, events, CONFIG_MAX_EPOLL_EVENTS, -1);

		if (cio_unlikely(num_events < 0)) {
			if (errno == EINTR) {
				continue;
			}

			return (enum cio_error)(-errno);
		}

		loop->num_events = (unsigned int)num_events;
		for (loop->event_counter = 0; loop->event_counter < loop->num_events; loop->event_counter++) {
			struct cio_event_notifier *evn = events[loop->event_counter].data.ptr;
			if (cio_unlikely(evn == &loop->stop_ev)) {
				goto out;
			}

			uint32_t events_type = events[loop->event_counter].events;
			loop->current_ev = evn;

			if ((events_type & (uint32_t)EPOLLIN & evn->registered_events) != 0) {
				evn->read_callback(evn->context, CIO_EPOLL_SUCCESS);
			}

			handle_removed_ev(loop, evn, events_type);
		}
	}

out:
	return CIO_SUCCESS;
}